

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void statPush(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  tRowcnt *ptVar1;
  int iChng_00;
  Stat4Accum *p_00;
  int iChng;
  Stat4Accum *p;
  int i;
  sqlite3_value *in_stack_ffffffffffffffd8;
  int local_1c;
  
  p_00 = (Stat4Accum *)sqlite3_value_blob(in_stack_ffffffffffffffd8);
  iChng_00 = sqlite3_value_int((sqlite3_value *)0x1a9c22);
  if (p_00->nRow == 0) {
    for (local_1c = 0; local_1c < p_00->nCol; local_1c = local_1c + 1) {
      (p_00->current).anEq[local_1c] = 1;
    }
  }
  else {
    samplePushPrevious(p_00,iChng_00);
    for (local_1c = 0; local_1c < iChng_00; local_1c = local_1c + 1) {
      ptVar1 = (p_00->current).anEq;
      ptVar1[local_1c] = ptVar1[local_1c] + 1;
    }
    while (local_1c = iChng_00, local_1c < p_00->nCol) {
      ptVar1 = (p_00->current).anDLt;
      ptVar1[local_1c] = ptVar1[local_1c] + 1;
      (p_00->current).anEq[local_1c] = 1;
      iChng_00 = local_1c + 1;
    }
  }
  p_00->nRow = p_00->nRow + 1;
  return;
}

Assistant:

static void statPush(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int i;

  /* The three function arguments */
  Stat4Accum *p = (Stat4Accum*)sqlite3_value_blob(argv[0]);
  int iChng = sqlite3_value_int(argv[1]);

  UNUSED_PARAMETER( argc );
  UNUSED_PARAMETER( context );
  assert( p->nCol>0 );
  assert( iChng<p->nCol );

  if( p->nRow==0 ){
    /* This is the first call to this function. Do initialization. */
    for(i=0; i<p->nCol; i++) p->current.anEq[i] = 1;
  }else{
    /* Second and subsequent calls get processed here */
    samplePushPrevious(p, iChng);

    /* Update anDLt[], anLt[] and anEq[] to reflect the values that apply
    ** to the current row of the index. */
    for(i=0; i<iChng; i++){
      p->current.anEq[i]++;
    }
    for(i=iChng; i<p->nCol; i++){
      p->current.anDLt[i]++;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
      p->current.anLt[i] += p->current.anEq[i];
#endif
      p->current.anEq[i] = 1;
    }
  }
  p->nRow++;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( sqlite3_value_type(argv[2])==SQLITE_INTEGER ){
    sampleSetRowidInt64(p->db, &p->current, sqlite3_value_int64(argv[2]));
  }else{
    sampleSetRowid(p->db, &p->current, sqlite3_value_bytes(argv[2]),
                                       sqlite3_value_blob(argv[2]));
  }
  p->current.iHash = p->iPrn = p->iPrn*1103515245 + 12345;
#endif

#ifdef SQLITE_ENABLE_STAT4
  {
    tRowcnt nLt = p->current.anLt[p->nCol-1];

    /* Check if this is to be a periodic sample. If so, add it. */
    if( (nLt/p->nPSample)!=(nLt+1)/p->nPSample ){
      p->current.isPSample = 1;
      p->current.iCol = 0;
      sampleInsert(p, &p->current, p->nCol-1);
      p->current.isPSample = 0;
    }

    /* Update the aBest[] array. */
    for(i=0; i<(p->nCol-1); i++){
      p->current.iCol = i;
      if( i>=iChng || sampleIsBetterPost(p, &p->current, &p->aBest[i]) ){
        sampleCopy(p, &p->aBest[i], &p->current);
      }
    }
  }
#endif
}